

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGraph.cpp
# Opt level: O2

Instruction * __thiscall
Hpipe::InstructionGraph::make_boyer_moore_rec
          (InstructionGraph *this,
          Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_> *front,
          InstructionNextChar *next_char,int orig_front_size)

{
  pointer ppVar1;
  long lVar2;
  pointer ppVar3;
  pointer pCVar4;
  bool bVar5;
  ulong uVar6;
  InstructionMultiCond *pIVar7;
  Instruction *inst;
  pointer ppVar8;
  pointer pCVar9;
  Cond *c;
  Cond *c_00;
  long lVar10;
  pointer pCVar11;
  Vec<Hpipe::Cond> conds;
  Cond local_b8;
  Vec<Hpipe::Cond> old_conds;
  Cond t;
  Cond i;
  
  ppVar8 = (front->
           super_vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
           ).
           super__Vector_base<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (front->
           super_vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
           ).
           super__Vector_base<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = 1;
  do {
    if ((ulong)((long)ppVar1 - (long)ppVar8 >> 5) <= uVar6) {
      return &((InstructionMultiCond *)ppVar8->second)->super_Instruction;
    }
    ppVar3 = ppVar8 + uVar6;
    uVar6 = (ulong)((int)uVar6 + 1);
  } while ((InstructionMultiCond *)ppVar3->second == (InstructionMultiCond *)ppVar8->second);
  conds.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
  super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  conds.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
  super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  conds.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
  super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (; pCVar9 = conds.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                  super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
                  super__Vector_impl_data._M_finish,
      pCVar4 = conds.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
               super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
               super__Vector_impl_data._M_start, ppVar8 != ppVar1; ppVar8 = ppVar8 + 1) {
    std::vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>::vector
              (&old_conds.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>,
               (vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_> *)&conds);
    Cond::Cond(&t,(ppVar8->first).super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                  super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1);
    pCVar4 = old_conds.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
             super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
             super__Vector_impl_data._M_finish;
    c_00 = old_conds.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
           super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
           super__Vector_impl_data._M_start;
    if (conds.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
        super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        conds.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
        super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
        super__Vector_impl_data._M_start) {
      conds.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
      super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.super__Vector_impl_data.
      _M_finish = conds.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                  super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    for (; c_00 != pCVar4; c_00 = c_00 + 1) {
      Cond::operator&(&i,&t,c_00);
      bVar5 = Cond::operator_cast_to_bool(&i);
      if (bVar5) {
        std::vector<Hpipe::Cond,std::allocator<Hpipe::Cond>>::emplace_back<Hpipe::Cond_const&>
                  ((vector<Hpipe::Cond,std::allocator<Hpipe::Cond>> *)&conds,&i);
      }
      Cond::operator~(&local_b8,&t);
      Cond::operator&(&i,&local_b8,c_00);
      bVar5 = Cond::operator_cast_to_bool(&i);
      if (bVar5) {
        std::vector<Hpipe::Cond,std::allocator<Hpipe::Cond>>::emplace_back<Hpipe::Cond_const&>
                  ((vector<Hpipe::Cond,std::allocator<Hpipe::Cond>> *)&conds,&i);
      }
      Cond::operator~(&i,c_00);
      Cond::operator&=(&t,&i);
    }
    bVar5 = Cond::operator_cast_to_bool(&t);
    if (bVar5) {
      std::vector<Hpipe::Cond,std::allocator<Hpipe::Cond>>::emplace_back<Hpipe::Cond_const&>
                ((vector<Hpipe::Cond,std::allocator<Hpipe::Cond>> *)&conds,&t);
    }
    std::_Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>::~_Vector_base
              ((_Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_> *)&old_conds);
  }
  if (conds.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
      super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      conds.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
      super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    lVar10 = (long)conds.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                   super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)conds.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                   super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
                   super__Vector_impl_data._M_start;
    uVar6 = lVar10 >> 5;
    lVar2 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Hpipe::Cond*,std::vector<Hpipe::Cond,std::allocator<Hpipe::Cond>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Hpipe::InstructionGraph::make_boyer_moore_rec(Hpipe::Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,Hpipe::Instruction*>>const&,Hpipe::InstructionNextChar*,int)::__1>>
              (conds.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
               super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
               super__Vector_impl_data._M_start,
               conds.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
               super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar10 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Hpipe::Cond*,std::vector<Hpipe::Cond,std::allocator<Hpipe::Cond>>>,__gnu_cxx::__ops::_Iter_comp_iter<Hpipe::InstructionGraph::make_boyer_moore_rec(Hpipe::Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,Hpipe::Instruction*>>const&,Hpipe::InstructionNextChar*,int)::__1>>
                (pCVar4,pCVar9);
    }
    else {
      pCVar11 = pCVar4 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Hpipe::Cond*,std::vector<Hpipe::Cond,std::allocator<Hpipe::Cond>>>,__gnu_cxx::__ops::_Iter_comp_iter<Hpipe::InstructionGraph::make_boyer_moore_rec(Hpipe::Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,Hpipe::Instruction*>>const&,Hpipe::InstructionNextChar*,int)::__1>>
                (pCVar4,pCVar11);
      for (; pCVar11 != pCVar9; pCVar11 = pCVar11 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Hpipe::Cond*,std::vector<Hpipe::Cond,std::allocator<Hpipe::Cond>>>,__gnu_cxx::__ops::_Val_comp_iter<Hpipe::InstructionGraph::make_boyer_moore_rec(Hpipe::Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,Hpipe::Instruction*>>const&,Hpipe::InstructionNextChar*,int)::__1>>
                  (pCVar11);
      }
    }
  }
  pIVar7 = (InstructionMultiCond *)operator_new(0x198);
  ppVar8 = (front->
           super_vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
           ).
           super__Vector_base<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  InstructionMultiCond::InstructionMultiCond
            (pIVar7,&(next_char->super_Instruction).cx,&conds,
             (int)((ulong)((long)*(pointer *)
                                  ((long)&(ppVar8->first).
                                          super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_> +
                                  8) -
                          *(long *)&(ppVar8->first).
                                    super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>) >> 5) -
             orig_front_size);
  pIVar7 = PtrPool<Hpipe::Instruction,32>::operator<<
                     ((PtrPool<Hpipe::Instruction,32> *)&this->inst_pool,pIVar7);
  pCVar4 = conds.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
           super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar9 = conds.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
                super__Vector_impl_data._M_start; pCVar9 != pCVar4; pCVar9 = pCVar9 + 1) {
    i.p.super__Base_bitset<4UL>._M_w[2] = 0;
    i.p.super__Base_bitset<4UL>._M_w[0] = 0;
    i.p.super__Base_bitset<4UL>._M_w[1] = 0;
    ppVar1 = (front->
             super_vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
             ).
             super__Vector_base<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar8 = (front->
                  super_vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
                  ).
                  super__Vector_base<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar1; ppVar8 = ppVar8 + 1)
    {
      Cond::operator&(&t,(ppVar8->first).super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                         super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
                         super__Vector_impl_data._M_finish + -1,pCVar9);
      bVar5 = Cond::operator_cast_to_bool(&t);
      if (bVar5) {
        Vec<Hpipe::Cond>::up_to
                  ((Vec<Hpipe::Cond> *)&t,&ppVar8->first,
                   (int)((ulong)((long)(ppVar8->first).
                                       super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                                       super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(ppVar8->first).
                                      super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                                      super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 5) - 1);
        std::
        vector<std::pair<Hpipe::Vec<Hpipe::Cond>,Hpipe::Instruction*>,std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,Hpipe::Instruction*>>>
        ::emplace_back<Hpipe::Vec<Hpipe::Cond>,Hpipe::Instruction*const&>
                  ((vector<std::pair<Hpipe::Vec<Hpipe::Cond>,Hpipe::Instruction*>,std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,Hpipe::Instruction*>>>
                    *)&i,(Vec<Hpipe::Cond> *)&t,&ppVar8->second);
        std::_Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>::~_Vector_base
                  ((_Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_> *)&t);
      }
    }
    inst = make_boyer_moore_rec
                     (this,(Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_> *)&i,
                      next_char,orig_front_size);
    local_b8.p.super__Base_bitset<4UL>._M_w[0] = 0;
    local_b8.p.super__Base_bitset<4UL>._M_w[1] = 0;
    local_b8.p.super__Base_bitset<4UL>._M_w[2] = 0;
    Transition::Transition((Transition *)&t,inst,(Vec<unsigned_int> *)&local_b8,-1.0);
    std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
    emplace_back<Hpipe::Transition_const&>
              ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)
               &(pIVar7->super_Instruction).next,(Transition *)&t);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
               (t.p.super__Base_bitset<4UL>._M_w + 1));
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b8);
    local_b8.p.super__Base_bitset<4UL>._M_w[0] = 0;
    local_b8.p.super__Base_bitset<4UL>._M_w[1] = 0;
    local_b8.p.super__Base_bitset<4UL>._M_w[2] = 0;
    Transition::Transition
              ((Transition *)&t,&pIVar7->super_Instruction,(Vec<unsigned_int> *)&local_b8,-1.0);
    std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
    emplace_back<Hpipe::Transition_const&>
              ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&inst->prev,
               (Transition *)&t);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
               (t.p.super__Base_bitset<4UL>._M_w + 1));
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b8);
    std::
    vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
    ::~vector((vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
               *)&i);
  }
  std::_Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>::~_Vector_base
            ((_Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_> *)&conds);
  return &pIVar7->super_Instruction;
}

Assistant:

Instruction *InstructionGraph::make_boyer_moore_rec( const Vec<std::pair<Vec<Cond>, Instruction *> > &front, InstructionNextChar *next_char, int orig_front_size ) {
    //
    auto same_inst = [&]() {
        Instruction *f = front[ 0 ].second;
        for( unsigned i = 1; i < front.size(); ++i )
            if ( front[ i ].second != f )
                return false;
        return true;
    };
    if ( same_inst() )
        return front[ 0 ].second;

    // get the conds to test
    Vec<Cond> conds;
    for( const auto &p : front ) {
        Vec<Cond> old_conds = conds;
        Cond t = p.first.back();
        conds.clear();
        for( const Cond &c : old_conds ) {
            if ( Cond i = t & c )
                conds << i;
            if ( Cond i = ~t & c )
                conds << i;
            t &= ~c;
        }
        if ( t )
            conds << t;
    }
    std::sort( conds.begin(), conds.end(), []( const Cond &a, const Cond &b ) {
        return a.nz() < b.nz();
    } );

    //
    InstructionMultiCond *res = inst_pool << new InstructionMultiCond( next_char->cx, conds, front[ 0 ].first.size() - orig_front_size );
    for( const Cond &cond : conds ) {
        Vec<std::pair<Vec<Cond>, Instruction *> > new_front;
        for( const std::pair<Vec<Cond>, Instruction *> &p : front )
            if ( p.first.back() & cond )
                new_front.emplace_back( p.first.up_to( p.first.size() - 1 ), p.second );

        Instruction *next = make_boyer_moore_rec( new_front, next_char, orig_front_size );
        res->next << next;
        next->prev << res;
    }

    return res;

}